

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

int dds_test(stbi *s)

{
  int iVar1;
  uint32 uVar2;
  stbi *s_local;
  
  iVar1 = get8(s);
  if (iVar1 == 0x44) {
    iVar1 = get8(s);
    if (iVar1 == 0x44) {
      iVar1 = get8(s);
      if (iVar1 == 0x53) {
        iVar1 = get8(s);
        if (iVar1 == 0x20) {
          uVar2 = get32le(s);
          if (uVar2 == 0x7c) {
            s_local._4_4_ = 1;
          }
          else {
            s_local._4_4_ = 0;
          }
        }
        else {
          s_local._4_4_ = 0;
        }
      }
      else {
        s_local._4_4_ = 0;
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int dds_test(stbi *s)
{
	//	check the magic number
	if (get8(s) != 'D') return 0;
	if (get8(s) != 'D') return 0;
	if (get8(s) != 'S') return 0;
	if (get8(s) != ' ') return 0;
	//	check header size
	if (get32le(s) != 124) return 0;
	return 1;
}